

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O2

VmValue * CompileVmZeroInitialize(ExpressionContext *ctx,VmModule *module,ExprZeroInitialize *node)

{
  TypeBase *pTVar1;
  SynBase *source;
  VmValue *pVVar2;
  ulong uVar3;
  VmConstant *pVVar4;
  VmConstant *el1;
  VmConstant *el2;
  VmValueType VVar5;
  VmType type;
  SynBase *local_48;
  
  pTVar1 = node->address->type;
  if ((pTVar1 == (TypeBase *)0x0) || (pTVar1->typeID != 0x12)) {
    __assert_fail("refType",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0xd7d,
                  "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                 );
  }
  pVVar2 = CompileVm(ctx,module,node->address);
  type = GetVmType(ctx,(TypeBase *)pTVar1[1]._vptr_TypeBase);
  VVar5 = type.type;
  uVar3 = type._0_8_ >> 0x20;
  if ((VVar5 == VM_TYPE_INT && uVar3 == 4) ||
     ((VVar5 & ~VM_TYPE_INT) == VM_TYPE_DOUBLE && type.size == 8)) {
    pVVar4 = CreateConstantZero(ctx->allocator,(node->super_ExprBase).source,type);
  }
  else {
    switch(VVar5) {
    case VM_TYPE_POINTER:
      pVVar4 = CreateConstantPointer
                         (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                          (TypeBase *)pTVar1[1]._vptr_TypeBase,false);
      goto LAB_0019d5be;
    case VM_TYPE_FUNCTION_REF:
    case VM_TYPE_ARRAY_REF:
      local_48 = (node->super_ExprBase).source;
      pVVar4 = CreateConstantPointer
                         (module->allocator,local_48,0,(VariableData *)0x0,ctx->typeNullPtr,false);
      el1 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
      break;
    case VM_TYPE_AUTO_REF:
      local_48 = (node->super_ExprBase).source;
      pVVar4 = CreateConstantInt(module->allocator,local_48,0);
      el1 = CreateConstantPointer
                      (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                       ctx->typeNullPtr,false);
      break;
    case VM_TYPE_AUTO_ARRAY:
      local_48 = (node->super_ExprBase).source;
      pVVar4 = CreateConstantInt(module->allocator,local_48,0);
      el1 = CreateConstantPointer
                      (module->allocator,(node->super_ExprBase).source,0,(VariableData *)0x0,
                       ctx->typeNullPtr,false);
      el2 = CreateConstantInt(module->allocator,(node->super_ExprBase).source,0);
      goto LAB_0019d743;
    case VM_TYPE_STRUCT:
      if (uVar3 != 0) {
        source = (node->super_ExprBase).source;
        pVVar4 = CreateConstantZero(ctx->allocator,source,(VmType)ZEXT816(0x400000001));
        anon_unknown.dwarf_11cad6::CreateSetRange
                  (module,source,pVVar2,type.size >> 2,&pVVar4->super_VmValue,4);
      }
      goto LAB_0019d5de;
    default:
      __assert_fail("!\"unknown type\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                    ,0xdae,
                    "VmValue *CompileVmZeroInitialize(ExpressionContext &, VmModule *, ExprZeroInitialize *)"
                   );
    }
    el2 = (VmConstant *)0x0;
LAB_0019d743:
    pVVar4 = (VmConstant *)
             anon_unknown.dwarf_11cad6::CreateConstruct
                       (module,local_48,type,&pVVar4->super_VmValue,&el1->super_VmValue,
                        &el2->super_VmValue,&pVVar4->super_VmValue);
  }
LAB_0019d5be:
  anon_unknown.dwarf_11cad6::CreateStore
            (ctx,module,(node->super_ExprBase).source,(TypeBase *)pTVar1[1]._vptr_TypeBase,pVVar2,
             &pVVar4->super_VmValue,0);
LAB_0019d5de:
  pVVar2 = anon_unknown.dwarf_11cad6::CreateVoid(module);
  pVVar2 = anon_unknown.dwarf_11cad6::CheckType(ctx,&node->super_ExprBase,pVVar2);
  return pVVar2;
}

Assistant:

VmValue* CompileVmZeroInitialize(ExpressionContext &ctx, VmModule *module, ExprZeroInitialize *node)
{
	TypeRef *refType = getType<TypeRef>(node->address->type);

	assert(refType);

	VmValue *address = CompileVm(ctx, module, node->address);

	VmType vmType = GetVmType(ctx, refType->subType);

	if(vmType == VmType::Int || vmType == VmType::Double || vmType == VmType::Long)
	{
		VmValue *initializer = CreateConstantZero(ctx.allocator, node->source, vmType);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_POINTER)
	{
		VmValue *initializer = CreateConstantPointer(module->allocator, node->source, 0, NULL, refType->subType, false);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_FUNCTION_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_ARRAY_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_REF)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), NULL, NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_AUTO_ARRAY)
	{
		VmValue *initializer = CreateConstruct(module, node->source, vmType, CreateConstantInt(module->allocator, node->source, 0), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), CreateConstantInt(module->allocator, node->source, 0), NULL);

		CreateStore(ctx, module, node->source, refType->subType, address, initializer, 0);
	}
	else if(vmType.type == VM_TYPE_STRUCT)
	{
		if(vmType.size != 0)
			CreateSetRange(module, node->source, address, vmType.size / 4, CreateConstantZero(ctx.allocator, node->source, VmType::Int), 4);
	}
	else// if(vmType != VmType::Void)
	{
		assert(!"unknown type");
	}

	return CheckType(ctx, node, CreateVoid(module));
}